

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O0

int png_check_fp_number(png_const_charp string,size_t size,int *statep,png_size_tp whereami)

{
  uint local_3c;
  size_t sStack_38;
  int type;
  size_t i;
  int state;
  png_size_tp whereami_local;
  int *statep_local;
  size_t size_local;
  png_const_charp string_local;
  
  i._4_4_ = *statep;
  for (sStack_38 = *whereami; sStack_38 < size; sStack_38 = sStack_38 + 1) {
    switch(string[sStack_38]) {
    case '+':
      local_3c = 4;
      break;
    default:
      goto LAB_0011207c;
    case '-':
      local_3c = 0x84;
      break;
    case '.':
      local_3c = 0x10;
      break;
    case '0':
      local_3c = 8;
      break;
    case '1':
    case '2':
    case '3':
    case '4':
    case '5':
    case '6':
    case '7':
    case '8':
    case '9':
      local_3c = 0x108;
      break;
    case 'E':
    case 'e':
      local_3c = 0x20;
    }
    switch(((i._4_4_ & 3) - 4) + (local_3c & 0x3c)) {
    case 0:
      if ((i._4_4_ & 0x3c) != 0) goto LAB_0011207c;
      i._4_4_ = local_3c | i._4_4_;
      break;
    default:
      goto LAB_0011207c;
    case 2:
      if ((i._4_4_ & 0x3c) != 0) goto LAB_0011207c;
      i._4_4_ = i._4_4_ | 4;
      break;
    case 4:
      if ((i._4_4_ & 0x10) != 0) {
        i._4_4_ = i._4_4_ & 0x1c0 | 0x11;
      }
      i._4_4_ = local_3c | 0x40 | i._4_4_;
      break;
    case 5:
      i._4_4_ = local_3c | 0x40 | i._4_4_;
      break;
    case 6:
      i._4_4_ = i._4_4_ | 0x48;
      break;
    case 0xc:
      if ((i._4_4_ & 0x10) != 0) goto LAB_0011207c;
      if ((i._4_4_ & 8) == 0) {
        i._4_4_ = local_3c | 1 | i._4_4_ & 0x1c0;
      }
      else {
        i._4_4_ = local_3c | i._4_4_;
      }
      break;
    case 0x1c:
      if ((i._4_4_ & 8) == 0) goto LAB_0011207c;
      i._4_4_ = i._4_4_ & 0x1c0 | 2;
      break;
    case 0x1d:
      if ((i._4_4_ & 8) == 0) goto LAB_0011207c;
      i._4_4_ = i._4_4_ & 0x1c0 | 2;
    }
  }
LAB_0011207c:
  *statep = i._4_4_;
  *whereami = sStack_38;
  return (int)((i._4_4_ & 8) != 0);
}

Assistant:

int /* PRIVATE */
png_check_fp_number(png_const_charp string, size_t size, int *statep,
    png_size_tp whereami)
{
   int state = *statep;
   size_t i = *whereami;

   while (i < size)
   {
      int type;
      /* First find the type of the next character */
      switch (string[i])
      {
      case 43:  type = PNG_FP_SAW_SIGN;                   break;
      case 45:  type = PNG_FP_SAW_SIGN + PNG_FP_NEGATIVE; break;
      case 46:  type = PNG_FP_SAW_DOT;                    break;
      case 48:  type = PNG_FP_SAW_DIGIT;                  break;
      case 49: case 50: case 51: case 52:
      case 53: case 54: case 55: case 56:
      case 57:  type = PNG_FP_SAW_DIGIT + PNG_FP_NONZERO; break;
      case 69:
      case 101: type = PNG_FP_SAW_E;                      break;
      default:  goto PNG_FP_End;
      }

      /* Now deal with this type according to the current
       * state, the type is arranged to not overlap the
       * bits of the PNG_FP_STATE.
       */
      switch ((state & PNG_FP_STATE) + (type & PNG_FP_SAW_ANY))
      {
      case PNG_FP_INTEGER + PNG_FP_SAW_SIGN:
         if ((state & PNG_FP_SAW_ANY) != 0)
            goto PNG_FP_End; /* not a part of the number */

         png_fp_add(state, type);
         break;

      case PNG_FP_INTEGER + PNG_FP_SAW_DOT:
         /* Ok as trailer, ok as lead of fraction. */
         if ((state & PNG_FP_SAW_DOT) != 0) /* two dots */
            goto PNG_FP_End;

         else if ((state & PNG_FP_SAW_DIGIT) != 0) /* trailing dot? */
            png_fp_add(state, type);

         else
            png_fp_set(state, PNG_FP_FRACTION | type);

         break;

      case PNG_FP_INTEGER + PNG_FP_SAW_DIGIT:
         if ((state & PNG_FP_SAW_DOT) != 0) /* delayed fraction */
            png_fp_set(state, PNG_FP_FRACTION | PNG_FP_SAW_DOT);

         png_fp_add(state, type | PNG_FP_WAS_VALID);

         break;

      case PNG_FP_INTEGER + PNG_FP_SAW_E:
         if ((state & PNG_FP_SAW_DIGIT) == 0)
            goto PNG_FP_End;

         png_fp_set(state, PNG_FP_EXPONENT);

         break;

   /* case PNG_FP_FRACTION + PNG_FP_SAW_SIGN:
         goto PNG_FP_End; ** no sign in fraction */

   /* case PNG_FP_FRACTION + PNG_FP_SAW_DOT:
         goto PNG_FP_End; ** Because SAW_DOT is always set */

      case PNG_FP_FRACTION + PNG_FP_SAW_DIGIT:
         png_fp_add(state, type | PNG_FP_WAS_VALID);
         break;

      case PNG_FP_FRACTION + PNG_FP_SAW_E:
         /* This is correct because the trailing '.' on an
          * integer is handled above - so we can only get here
          * with the sequence ".E" (with no preceding digits).
          */
         if ((state & PNG_FP_SAW_DIGIT) == 0)
            goto PNG_FP_End;

         png_fp_set(state, PNG_FP_EXPONENT);

         break;

      case PNG_FP_EXPONENT + PNG_FP_SAW_SIGN:
         if ((state & PNG_FP_SAW_ANY) != 0)
            goto PNG_FP_End; /* not a part of the number */

         png_fp_add(state, PNG_FP_SAW_SIGN);

         break;

   /* case PNG_FP_EXPONENT + PNG_FP_SAW_DOT:
         goto PNG_FP_End; */

      case PNG_FP_EXPONENT + PNG_FP_SAW_DIGIT:
         png_fp_add(state, PNG_FP_SAW_DIGIT | PNG_FP_WAS_VALID);

         break;

   /* case PNG_FP_EXPONEXT + PNG_FP_SAW_E:
         goto PNG_FP_End; */

      default: goto PNG_FP_End; /* I.e. break 2 */
      }

      /* The character seems ok, continue. */
      ++i;
   }

PNG_FP_End:
   /* Here at the end, update the state and return the correct
    * return code.
    */
   *statep = state;
   *whereami = i;

   return (state & PNG_FP_SAW_DIGIT) != 0;
}